

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_grid.c
# Opt level: O0

REF_STATUS
ref_grid_contiguous_group_cell
          (REF_GRID ref_grid,REF_INT contiguous_cell,REF_INT *cell_group,REF_INT *cell)

{
  int local_3c;
  REF_CELL pRStack_38;
  REF_INT group;
  REF_CELL ref_cell;
  REF_INT *cell_local;
  REF_INT *cell_group_local;
  REF_INT contiguous_cell_local;
  REF_GRID ref_grid_local;
  
  if (contiguous_cell < 0) {
    *cell_group = -1;
    *cell = -1;
    ref_grid_local._4_4_ = 5;
  }
  else {
    *cell = contiguous_cell;
    *cell_group = -1;
    local_3c = 0;
    pRStack_38 = ref_grid->cell[0];
    while (local_3c < 0x10) {
      if (((0 < pRStack_38->n) && (-1 < *cell)) && (*cell < pRStack_38->n)) {
        *cell_group = local_3c;
        break;
      }
      *cell = *cell - pRStack_38->n;
      local_3c = local_3c + 1;
      pRStack_38 = ref_grid->cell[local_3c];
    }
    if (*cell_group == -1) {
      *cell = -1;
      ref_grid_local._4_4_ = 5;
    }
    else {
      ref_grid_local._4_4_ = 0;
    }
  }
  return ref_grid_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_grid_contiguous_group_cell(REF_GRID ref_grid,
                                                  REF_INT contiguous_cell,
                                                  REF_INT *cell_group,
                                                  REF_INT *cell) {
  REF_CELL ref_cell;
  REF_INT group;
  if (contiguous_cell < 0) {
    *cell_group = REF_EMPTY;
    *cell = REF_EMPTY;
    return REF_NOT_FOUND;
  }
  *cell = contiguous_cell;
  *cell_group = REF_EMPTY;
  each_ref_grid_all_ref_cell(ref_grid, group, ref_cell) {
    if (0 < ref_cell_n(ref_cell) && 0 <= *cell &&
        *cell < ref_cell_n(ref_cell)) {
      *cell_group = group;
      break;
    }
    (*cell) -= ref_cell_n(ref_cell);
  }
  if (REF_EMPTY == *cell_group) {
    *cell = REF_EMPTY;
    return REF_NOT_FOUND;
  }
  return REF_SUCCESS;
}